

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IStringReader.cpp
# Opt level: O1

void __thiscall IStringReader::getWord(IStringReader *this,string *str)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char cVar4;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  cVar1 = std::istream::get();
  if ((cVar1 != -1) && (bVar2 = IDictionary::isQuotation2(cVar1), bVar2)) {
    cVar4 = (char)str;
    std::__cxx11::string::push_back(cVar4);
    cVar1 = std::istream::get();
    if (cVar1 != -1) {
      do {
        bVar2 = IDictionary::isQuotation2(cVar1);
        if (bVar2) {
          std::__cxx11::string::push_back(cVar4);
          return;
        }
        bVar2 = IDictionary::isQuotation1(cVar1);
        if (bVar2) {
          std::__cxx11::string::substr((ulong)local_50,(ulong)str);
          std::__cxx11::string::operator=((string *)str,(string *)local_50);
          if (local_50[0] != local_40) {
            operator_delete(local_50[0]);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"string_error",0xc);
        }
        else {
          bVar2 = IDictionary::isSlash(cVar1);
          std::__cxx11::string::push_back(cVar4);
          if (bVar2) {
            std::istream::tellg();
            iVar3 = ICharReader::readSpecialChar((this->super_IAbstractReader).m_ifs,str);
            if (iVar3 == 0) {
              std::__cxx11::string::substr((ulong)local_50,(ulong)str);
              std::__cxx11::string::operator=((string *)str,(string *)local_50);
              if (local_50[0] != local_40) {
                operator_delete(local_50[0]);
              }
            }
          }
        }
        cVar1 = std::istream::get();
      } while (cVar1 != -1);
    }
  }
  return;
}

Assistant:

void IStringReader::getWord(std::string &str) {
    char tempChar;
    int base_len=str.length();

    if((tempChar=m_ifs->get())!=EOF)
    {
        if(IDictionary::isQuotation2(tempChar))
        {
            str+=tempChar;
            while((tempChar=m_ifs->get())!=EOF)
            {
                if(IDictionary::isQuotation2(tempChar))
                {
                    str+=tempChar;
                    break;
                }
                else if(IDictionary::isQuotation1(tempChar))
                {
                    str=str.substr(0,base_len);

                    std::cerr<<"string_error";
                }
                else if(IDictionary::isSlash(tempChar))
                {
                    str+=tempChar;

                    int temp_pos=m_ifs->tellg();
                    int temp=ICharReader::readSpecialChar(m_ifs,str);
                    if(!temp)
                    {
                        str=str.substr(0,base_len);
                    }
                }
                else
                {
                    str+=tempChar;
                }
            }
        }
    }
}